

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XTemplateSerializer.cpp
# Opt level: O0

void xercesc_4_0::XTemplateSerializer::storeObject
               (RefVectorOf<xercesc_4_0::IdentityConstraint> *objToStore,XSerializeEngine *serEng)

{
  bool bVar1;
  IdentityConstraint *t;
  IdentityConstraint *ic;
  IdentityConstraint *data;
  XMLSize_t i;
  XMLSize_t vectorLength;
  XSerializeEngine *serEng_local;
  RefVectorOf<xercesc_4_0::IdentityConstraint> *objToStore_local;
  
  bVar1 = XSerializeEngine::needToStoreObject(serEng,objToStore);
  if (bVar1) {
    t = (IdentityConstraint *)
        BaseRefVectorOf<xercesc_4_0::IdentityConstraint>::size
                  (&objToStore->super_BaseRefVectorOf<xercesc_4_0::IdentityConstraint>);
    XSerializeEngine::writeSize(serEng,(XMLSize_t)t);
    for (data = (IdentityConstraint *)0x0; data < t;
        data = (IdentityConstraint *)((long)&(data->super_XSerializable)._vptr_XSerializable + 1)) {
      ic = BaseRefVectorOf<xercesc_4_0::IdentityConstraint>::elementAt
                     (&objToStore->super_BaseRefVectorOf<xercesc_4_0::IdentityConstraint>,
                      (XMLSize_t)data);
      IdentityConstraint::storeIC(serEng,ic);
    }
  }
  return;
}

Assistant:

void XTemplateSerializer::storeObject(RefVectorOf<IdentityConstraint>* const objToStore
                                    , XSerializeEngine&                       serEng)
{

    if (serEng.needToStoreObject(objToStore))
    {
        XMLSize_t vectorLength = objToStore->size();
        serEng.writeSize (vectorLength);

        for ( XMLSize_t i = 0; i < vectorLength; i++)
        {
            IdentityConstraint* data = objToStore->elementAt(i);
            IdentityConstraint::storeIC(serEng, data);
        }
    }

}